

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

void __thiscall OpenMD::FragmentStamp::FragmentStamp(FragmentStamp *this)

{
  allocator<char> local_b9 [9];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_58;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__FragmentStamp_002f3f70;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(&this->Name);
  memset(&this->atomStamps_,0,0x120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"name",(allocator<char> *)&local_b0);
  std::__cxx11::string::_M_assign((string *)&(this->Name).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"name",local_b9);
  local_58.first._M_string_length = local_a8;
  local_58.first._M_dataplus._M_p = (pointer)&local_58.first.field_2;
  if (local_b0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0) {
    local_58.first.field_2._8_8_ = uStack_98;
  }
  else {
    local_58.first._M_dataplus._M_p = (pointer)local_b0;
  }
  local_a8 = 0;
  local_a0[0] = '\0';
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a0;
  local_58.second = &(this->Name).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)&(this->super_DataHolder).parameters_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

FragmentStamp::FragmentStamp() { DefineParameter(Name, "name"); }